

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::NestedTestAllTypes::Clear(NestedTestAllTypes *this)

{
  NestedTestAllTypes *pNVar1;
  TestAllTypes *pTVar2;
  anon_union_64_1_493b367e_for_NestedTestAllTypes_3 aVar3;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::NestedTestAllTypes>>
            (&(this->field_0)._impl_.repeated_child_.super_RepeatedPtrFieldBase);
  aVar3 = this->field_0;
  if (((undefined1  [64])aVar3 & (undefined1  [64])0xf) != (undefined1  [64])0x0) {
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
      pNVar1 = (this->field_0)._impl_.child_;
      if (pNVar1 == (NestedTestAllTypes *)0x0) {
        failure_msg = "_impl_.child_ != nullptr";
        line = 0x2aca;
        goto LAB_009b644f;
      }
      Clear(pNVar1);
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      pTVar2 = (this->field_0)._impl_.payload_;
      if (pTVar2 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.payload_ != nullptr";
        line = 0x2ace;
        goto LAB_009b644f;
      }
      edition_unittest::TestAllTypes::Clear(pTVar2);
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      pNVar1 = (this->field_0)._impl_.lazy_child_;
      if (pNVar1 == (NestedTestAllTypes *)0x0) {
        failure_msg = "_impl_.lazy_child_ != nullptr";
        line = 0x2ad2;
        goto LAB_009b644f;
      }
      Clear(pNVar1);
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
      pTVar2 = (this->field_0)._impl_.eager_child_;
      if (pTVar2 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.eager_child_ != nullptr";
        line = 0x2ad6;
LAB_009b644f:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      edition_unittest::TestAllTypes::Clear(pTVar2);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void NestedTestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.NestedTestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_child_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.payload_ != nullptr);
      _impl_.payload_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.lazy_child_ != nullptr);
      _impl_.lazy_child_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.eager_child_ != nullptr);
      _impl_.eager_child_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}